

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O0

void __thiscall JAMA::Eigenvalue<double>::tred2(Eigenvalue<double> *this)

{
  double dVar1;
  value_type vVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  double *pdVar7;
  reference pvVar8;
  int __x;
  uint *in_RDI;
  double extraout_XMM0_Qa;
  int j_8;
  int k_7;
  int k_6;
  int k_5;
  double g_1;
  int j_7;
  int k_4;
  double h_1;
  int i_1;
  int k_3;
  int j_6;
  int j_5;
  double hh;
  int j_4;
  int k_2;
  int j_3;
  int j_2;
  double g;
  double f;
  int k_1;
  int j_1;
  int k;
  double h;
  double scale;
  int i;
  int j;
  double in_stack_fffffffffffffe78;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffe80;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  DynamicVector<double,_std::allocator<double>_> *local_80;
  uint local_78;
  uint local_74;
  uint local_68;
  uint local_64;
  uint local_60;
  int local_5c;
  int local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  double local_40;
  double local_38;
  int local_2c;
  uint local_28;
  int local_24;
  value_type local_20;
  double local_18;
  uint local_10;
  uint local_c;
  
  for (local_c = 0; (int)local_c < (int)*in_RDI; local_c = local_c + 1) {
    pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                       ((DynamicRectMatrix<double> *)(in_RDI + 0xe),*in_RDI - 1,local_c);
    dVar1 = *pdVar7;
    pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                       (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
    *pvVar8 = dVar1;
  }
  uVar6 = *in_RDI;
  while (local_10 = uVar6 - 1, 0 < (int)local_10) {
    local_18 = 0.0;
    local_20 = 0.0;
    for (local_24 = 0; local_24 < (int)local_10; local_24 = local_24 + 1) {
      __x = (int)in_RDI + 8;
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      std::abs(__x);
      local_18 = local_18 + extraout_XMM0_Qa;
    }
    if ((local_18 != 0.0) || (NAN(local_18))) {
      for (local_2c = 0; local_2c < (int)local_10; local_2c = local_2c + 1) {
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        *pvVar8 = *pvVar8 / local_18;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        dVar1 = *pvVar8;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        local_20 = dVar1 * *pvVar8 + local_20;
      }
      pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      dVar1 = *pvVar8;
      local_40 = sqrt(local_20);
      if (0.0 < dVar1) {
        local_40 = -local_40;
      }
      pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      *pvVar8 = local_18 * local_40;
      local_20 = -dVar1 * local_40 + local_20;
      pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      *pvVar8 = dVar1 - local_40;
      for (local_44 = 0; local_44 < (int)local_10; local_44 = local_44 + 1) {
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        *pvVar8 = 0.0;
      }
      for (local_48 = 0; (int)local_48 < (int)local_10; local_48 = local_48 + 1) {
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        dVar1 = *pvVar8;
        pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_48,local_10);
        *pdVar7 = dVar1;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        local_40 = *pvVar8;
        pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_48,local_48);
        local_40 = *pdVar7 * dVar1 + local_40;
        local_4c = local_48;
        while (local_4c = local_4c + 1, (int)local_4c <= (int)(uVar6 - 2)) {
          pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_4c,local_48);
          dVar3 = *pdVar7;
          pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
          local_40 = dVar3 * *pvVar8 + local_40;
          pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_4c,local_48);
          dVar3 = *pdVar7;
          pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
          *pvVar8 = dVar3 * dVar1 + *pvVar8;
        }
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        *pvVar8 = local_40;
      }
      local_38 = 0.0;
      for (local_50 = 0; local_50 < (int)local_10; local_50 = local_50 + 1) {
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        *pvVar8 = *pvVar8 / local_20;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        dVar1 = *pvVar8;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        local_38 = dVar1 * *pvVar8 + local_38;
      }
      for (local_5c = 0; local_5c < (int)local_10; local_5c = local_5c + 1) {
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        dVar1 = *pvVar8;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        *pvVar8 = -(local_38 / (local_20 + local_20)) * dVar1 + *pvVar8;
      }
      for (local_60 = 0; (int)local_60 < (int)local_10; local_60 = local_60 + 1) {
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        dVar1 = *pvVar8;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        dVar3 = *pvVar8;
        for (local_64 = local_60; (int)local_64 <= (int)(uVar6 - 2); local_64 = local_64 + 1) {
          pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
          dVar4 = *pvVar8;
          pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
          dVar5 = *pvVar8;
          pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_64,local_60);
          *pdVar7 = *pdVar7 - (dVar1 * dVar4 + dVar3 * dVar5);
        }
        pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0xe),uVar6 - 2,local_60);
        dVar1 = *pdVar7;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        *pvVar8 = dVar1;
        pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_10,local_60);
        *pdVar7 = 0.0;
      }
    }
    else {
      pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      vVar2 = *pvVar8;
      pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      *pvVar8 = vVar2;
      for (local_28 = 0; (int)local_28 < (int)local_10; local_28 = local_28 + 1) {
        pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0xe),uVar6 - 2,local_28);
        dVar1 = *pdVar7;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        *pvVar8 = dVar1;
        pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_10,local_28);
        *pdVar7 = 0.0;
        pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_28,local_10);
        *pdVar7 = 0.0;
      }
    }
    pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                       (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
    *pvVar8 = local_20;
    uVar6 = local_10;
  }
  for (local_68 = 0; (int)local_68 < (int)(*in_RDI - 1); local_68 = local_68 + 1) {
    pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                       ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_68,local_68);
    dVar1 = *pdVar7;
    pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                       ((DynamicRectMatrix<double> *)(in_RDI + 0xe),*in_RDI - 1,local_68);
    *pdVar7 = dVar1;
    pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                       ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_68,local_68);
    *pdVar7 = 1.0;
    pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                       (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
    dVar1 = *pvVar8;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      for (local_74 = 0; (int)local_74 <= (int)local_68; local_74 = local_74 + 1) {
        pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_74,local_68 + 1);
        dVar3 = *pdVar7;
        pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        *pvVar8 = dVar3 / dVar1;
      }
      for (local_78 = 0; (int)local_78 <= (int)local_68; local_78 = local_78 + 1) {
        local_80 = (DynamicVector<double,_std::allocator<double>_> *)0x0;
        for (local_84 = 0; (int)local_84 <= (int)local_68; local_84 = local_84 + 1) {
          pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_84,local_68 + 1);
          dVar1 = *pdVar7;
          pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_84,local_78);
          local_80 = (DynamicVector<double,_std::allocator<double>_> *)
                     (dVar1 * *pdVar7 + (double)local_80);
        }
        for (local_88 = 0; (int)local_88 <= (int)local_68; local_88 = local_88 + 1) {
          in_stack_fffffffffffffe80 = local_80;
          pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (local_80,(size_type)in_stack_fffffffffffffe78);
          dVar1 = *pvVar8;
          pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_88,local_78);
          *pdVar7 = -(double)in_stack_fffffffffffffe80 * dVar1 + *pdVar7;
        }
      }
    }
    for (local_8c = 0; (int)local_8c <= (int)local_68; local_8c = local_8c + 1) {
      pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_8c,local_68 + 1);
      *pdVar7 = 0.0;
    }
  }
  for (local_90 = 0; (int)local_90 < (int)*in_RDI; local_90 = local_90 + 1) {
    pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                       ((DynamicRectMatrix<double> *)(in_RDI + 0xe),*in_RDI - 1,local_90);
    in_stack_fffffffffffffe78 = *pdVar7;
    pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                       (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
    *pvVar8 = in_stack_fffffffffffffe78;
    pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                       ((DynamicRectMatrix<double> *)(in_RDI + 0xe),*in_RDI - 1,local_90);
    *pdVar7 = 0.0;
  }
  pdVar7 = OpenMD::DynamicRectMatrix<double>::operator()
                     ((DynamicRectMatrix<double> *)(in_RDI + 0xe),*in_RDI - 1,*in_RDI - 1);
  *pdVar7 = 1.0;
  pvVar8 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                     (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  *pvVar8 = 0.0;
  return;
}

Assistant:

void tred2() {
      //  This is derived from the Algol procedures tred2 by
      //  Bowdler, Martin, Reinsch, and Wilkinson, Handbook for
      //  Auto. Comp., Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      for (int j = 0; j < n; j++) {
        d(j) = V(n - 1, j);
      }

      // Householder reduction to tridiagonal form.

      for (int i = n - 1; i > 0; i--) {
        // Scale to avoid under/overflow.

        Real scale = 0.0;
        Real h     = 0.0;
        for (int k = 0; k < i; k++) {
          scale = scale + abs(d(k));
        }
        if (scale == 0.0) {
          e(i) = d(i - 1);
          for (int j = 0; j < i; j++) {
            d(j)    = V(i - 1, j);
            V(i, j) = 0.0;
            V(j, i) = 0.0;
          }
        } else {
          // Generate Householder vector.

          for (int k = 0; k < i; k++) {
            d(k) /= scale;
            h += d(k) * d(k);
          }
          Real f = d(i - 1);
          Real g = sqrt(h);
          if (f > 0) { g = -g; }
          e(i)     = scale * g;
          h        = h - f * g;
          d(i - 1) = f - g;
          for (int j = 0; j < i; j++) {
            e(j) = 0.0;
          }

          // Apply similarity transformation to remaining columns.

          for (int j = 0; j < i; j++) {
            f       = d(j);
            V(j, i) = f;
            g       = e(j) + V(j, j) * f;
            for (int k = j + 1; k <= i - 1; k++) {
              g += V(k, j) * d(k);
              e(k) += V(k, j) * f;
            }
            e(j) = g;
          }
          f = 0.0;
          for (int j = 0; j < i; j++) {
            e(j) /= h;
            f += e(j) * d(j);
          }
          Real hh = f / (h + h);
          for (int j = 0; j < i; j++) {
            e(j) -= hh * d(j);
          }
          for (int j = 0; j < i; j++) {
            f = d(j);
            g = e(j);
            for (int k = j; k <= i - 1; k++) {
              V(k, j) -= (f * e(k) + g * d(k));
            }
            d(j)    = V(i - 1, j);
            V(i, j) = 0.0;
          }
        }
        d(i) = h;
      }

      // Accumulate transformations.

      for (int i = 0; i < n - 1; i++) {
        V(n - 1, i) = V(i, i);
        V(i, i)     = 1.0;
        Real h      = d(i + 1);
        if (h != 0.0) {
          for (int k = 0; k <= i; k++) {
            d(k) = V(k, i + 1) / h;
          }
          for (int j = 0; j <= i; j++) {
            Real g = 0.0;
            for (int k = 0; k <= i; k++) {
              g += V(k, i + 1) * V(k, j);
            }
            for (int k = 0; k <= i; k++) {
              V(k, j) -= g * d(k);
            }
          }
        }
        for (int k = 0; k <= i; k++) {
          V(k, i + 1) = 0.0;
        }
      }
      for (int j = 0; j < n; j++) {
        d(j)        = V(n - 1, j);
        V(n - 1, j) = 0.0;
      }
      V(n - 1, n - 1) = 1.0;
      e(0)            = 0.0;
    }